

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraLcr.c
# Opt level: O0

int Fra_LcrNodeIsConst(Aig_Obj_t *pObj)

{
  long lVar1;
  int iVar2;
  Aig_Man_t *p;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  int nPart;
  Aig_Obj_t *pOut;
  Aig_Man_t *pFraig;
  Fra_Lcr_t *pLcr;
  Fra_Man_t *pTemp;
  Aig_Obj_t *pObj_local;
  
  lVar1 = *(long *)((long)(pObj->field_5).pData + 0x40);
  iVar2 = Aig_ObjIsCi(pObj);
  if (iVar2 != 0) {
    p = (Aig_Man_t *)
        Vec_PtrEntry(*(Vec_Ptr_t **)(lVar1 + 0x28),
                     *(int *)(*(long *)(lVar1 + 0x18) + (long)(pObj->field_0).pNext * 4));
    pAVar3 = Aig_ManCo(p,*(int *)(*(long *)(lVar1 + 0x20) + (long)(pObj->field_0).pNext * 4));
    pAVar3 = Aig_ObjFanin0(pAVar3);
    pAVar4 = Aig_ManConst1(p);
    return (int)(pAVar3 == pAVar4);
  }
  __assert_fail("Aig_ObjIsCi(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraLcr.c"
                ,0xf6,"int Fra_LcrNodeIsConst(Aig_Obj_t *)");
}

Assistant:

int Fra_LcrNodeIsConst( Aig_Obj_t * pObj )
{
    Fra_Man_t * pTemp = (Fra_Man_t *)pObj->pData;
    Fra_Lcr_t * pLcr = (Fra_Lcr_t *)pTemp->pBmc;
    Aig_Man_t * pFraig;
    Aig_Obj_t * pOut;
    int nPart;
    assert( Aig_ObjIsCi(pObj) );
    // find the partition to which these nodes belong
    nPart = pLcr->pInToOutPart[(long)pObj->pNext];
    pFraig = (Aig_Man_t *)Vec_PtrEntry( pLcr->vFraigs, nPart );
    // get the fraig outputs
    pOut = Aig_ManCo( pFraig, pLcr->pInToOutNum[(long)pObj->pNext] );
    return Aig_ObjFanin0(pOut) == Aig_ManConst1(pFraig);
}